

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O0

int uv_tty_set_mode(uv_tty_t *tty,uv_tty_mode_t mode)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  undefined1 auStack_58 [4];
  int fd;
  termios tmp;
  uv_tty_mode_t mode_local;
  uv_tty_t *tty_local;
  
  if (tty->mode == mode) {
    tty_local._4_4_ = 0;
  }
  else {
    iVar3 = (tty->io_watcher).fd;
    tmp.c_ispeed = mode;
    unique0x10000499 = tty;
    if ((tty->mode == 0) && (mode != UV_TTY_MODE_NORMAL)) {
      iVar2 = tcgetattr(iVar3,(termios *)&tty->orig_termios);
      if (iVar2 != 0) {
        piVar4 = __errno_location();
        return -*piVar4;
      }
      uv_spinlock_lock(&termios_spinlock);
      if (orig_termios_fd == -1) {
        memcpy(&orig_termios,&stack0xffffffffffffffe8->orig_termios,0x3c);
        orig_termios_fd = iVar3;
      }
      uv_spinlock_unlock(&termios_spinlock);
    }
    auStack_58 = (stack0xffffffffffffffe8->orig_termios).c_iflag;
    unique0x10000164 = (stack0xffffffffffffffe8->orig_termios).c_oflag;
    tmp.c_iflag = (stack0xffffffffffffffe8->orig_termios).c_cflag;
    tmp.c_oflag = (stack0xffffffffffffffe8->orig_termios).c_lflag;
    tmp._8_8_ = *(undefined8 *)&(stack0xffffffffffffffe8->orig_termios).c_line;
    tmp.c_line = (stack0xffffffffffffffe8->orig_termios).c_cc[7];
    tmp.c_cc[0] = (stack0xffffffffffffffe8->orig_termios).c_cc[8];
    tmp.c_cc[1] = (stack0xffffffffffffffe8->orig_termios).c_cc[9];
    tmp.c_cc[2] = (stack0xffffffffffffffe8->orig_termios).c_cc[10];
    tmp.c_cc[3] = (stack0xffffffffffffffe8->orig_termios).c_cc[0xb];
    tmp.c_cc[4] = (stack0xffffffffffffffe8->orig_termios).c_cc[0xc];
    tmp.c_cc[5] = (stack0xffffffffffffffe8->orig_termios).c_cc[0xd];
    tmp.c_cc[6] = (stack0xffffffffffffffe8->orig_termios).c_cc[0xe];
    tmp.c_cc._7_8_ = *(undefined8 *)((stack0xffffffffffffffe8->orig_termios).c_cc + 0xf);
    uVar1 = *(undefined8 *)((stack0xffffffffffffffe8->orig_termios).c_cc + 0x17);
    tmp._44_8_ = *(undefined8 *)&(stack0xffffffffffffffe8->orig_termios).c_ispeed;
    tmp.c_cc._23_4_ =
         SUB84((ulong)*(undefined8 *)((stack0xffffffffffffffe8->orig_termios).c_cc + 0x1b) >> 0x20,0
              );
    tmp.c_cc._15_4_ = SUB84(uVar1,0);
    tmp.c_cc._19_4_ = SUB84((ulong)uVar1 >> 0x20,0);
    if (tmp.c_ispeed != 0) {
      if (tmp.c_ispeed == 1) {
        _auStack_58 = _auStack_58 & 0xfffffffffffffacd;
        _auStack_58 = _auStack_58 | 0x400000000;
        tmp._0_8_ = tmp._0_8_ & 0xffff7ff4ffffffff | 0x30;
        tmp._8_7_ = tmp._8_7_ & 0xffffffffffff;
        tmp.c_lflag._3_1_ = 1;
      }
      else if (tmp.c_ispeed == 2) {
        uv__tty_make_raw((termios *)auStack_58);
      }
    }
    iVar3 = tcsetattr(iVar3,1,(termios *)auStack_58);
    if (iVar3 == 0) {
      stack0xffffffffffffffe8->mode = tmp.c_ispeed;
      tty_local._4_4_ = 0;
    }
    else {
      piVar4 = __errno_location();
      tty_local._4_4_ = -*piVar4;
    }
  }
  return tty_local._4_4_;
}

Assistant:

int uv_tty_set_mode(uv_tty_t* tty, uv_tty_mode_t mode) {
  struct termios tmp;
  int fd;

  if (tty->mode == (int) mode)
    return 0;

  fd = uv__stream_fd(tty);
  if (tty->mode == UV_TTY_MODE_NORMAL && mode != UV_TTY_MODE_NORMAL) {
    if (tcgetattr(fd, &tty->orig_termios))
      return -errno;

    /* This is used for uv_tty_reset_mode() */
    uv_spinlock_lock(&termios_spinlock);
    if (orig_termios_fd == -1) {
      orig_termios = tty->orig_termios;
      orig_termios_fd = fd;
    }
    uv_spinlock_unlock(&termios_spinlock);
  }

  tmp = tty->orig_termios;
  switch (mode) {
    case UV_TTY_MODE_NORMAL:
      break;
    case UV_TTY_MODE_RAW:
      tmp.c_iflag &= ~(BRKINT | ICRNL | INPCK | ISTRIP | IXON);
      tmp.c_oflag |= (ONLCR);
      tmp.c_cflag |= (CS8);
      tmp.c_lflag &= ~(ECHO | ICANON | IEXTEN | ISIG);
      tmp.c_cc[VMIN] = 1;
      tmp.c_cc[VTIME] = 0;
      break;
    case UV_TTY_MODE_IO:
      uv__tty_make_raw(&tmp);
      break;
  }

  /* Apply changes after draining */
  if (tcsetattr(fd, TCSADRAIN, &tmp))
    return -errno;

  tty->mode = mode;
  return 0;
}